

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strength_reduction_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::StrengthReductionPass::ReplaceMultiplyByPowerOf2
          (StrengthReductionPass *this,iterator *inst)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t res_id;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  ulong uVar6;
  Operand *__x;
  initializer_list<unsigned_int> init_list;
  iterator local_b0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> newOperands;
  Operand shiftOperand;
  SmallVector<unsigned_int,_2UL> local_58;
  
  pIVar5 = (inst->super_iterator).node_;
  if (pIVar5->opcode_ != OpIMul) {
    __assert_fail("(*inst)->opcode() == spv::Op::OpIMul && \"Only works for multiplication of integers.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/strength_reduction_pass.cpp"
                  ,0x45,
                  "bool spvtools::opt::StrengthReductionPass::ReplaceMultiplyByPowerOf2(BasicBlock::iterator *)"
                 );
  }
  uVar2 = Instruction::type_id(pIVar5);
  if ((uVar2 == *(uint32_t *)&(this->super_Pass).field_0x34) ||
     (uVar2 = Instruction::type_id((inst->super_iterator).node_), uVar2 == this->uint32_type_id_)) {
    for (uVar2 = 0; uVar2 != 2; uVar2 = uVar2 + 1) {
      uVar3 = Instruction::GetSingleWordInOperand((inst->super_iterator).node_,uVar2);
      pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
      pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar3);
      if (pIVar5->opcode_ == OpConstant) {
        uVar3 = Instruction::GetSingleWordOperand(pIVar5,2);
        uVar6 = (ulong)uVar3;
        if (uVar3 - 1 < (uVar3 ^ uVar3 - 1)) {
          uVar3 = 0;
          for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1) {
            uVar3 = uVar3 + 1;
          }
          uVar3 = GetConstantId(this,uVar3);
          res_id = Pass::TakeNextId(&this->super_Pass);
          newOperands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          newOperands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          newOperands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          __x = Instruction::GetInOperand((inst->super_iterator).node_,1 - uVar2);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    (&newOperands,__x);
          init_list._M_len = 1;
          init_list._M_array = (iterator)&local_b0;
          local_b0.super_iterator.node_._0_4_ = uVar3;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
          shiftOperand.type = SPV_OPERAND_TYPE_ID;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&shiftOperand.words,&local_58);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    (&newOperands,&shiftOperand);
          pIVar5 = (Instruction *)::operator_new(0x70);
          pIVar1 = (this->super_Pass).context_;
          uVar2 = Instruction::type_id((inst->super_iterator).node_);
          Instruction::Instruction(pIVar5,pIVar1,OpShiftLeftLogical,uVar2,res_id,&newOperands);
          local_58._vptr_SmallVector = (_func_int **)pIVar5;
          InstructionList::iterator::InsertBefore
                    (&local_b0,
                     (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)inst);
          (inst->super_iterator).node_ =
               (Instruction *)
               CONCAT44(local_b0.super_iterator.node_._4_4_,(uint32_t)local_b0.super_iterator.node_)
          ;
          pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
          analysis::DefUseManager::AnalyzeInstDefUse(pDVar4,(inst->super_iterator).node_);
          pIVar5 = (((inst->super_iterator).node_)->
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          (inst->super_iterator).node_ = pIVar5;
          pIVar1 = (this->super_Pass).context_;
          uVar2 = Instruction::result_id(pIVar5);
          IRContext::ReplaceAllUsesWith(pIVar1,uVar2,res_id);
          pIVar5 = (inst->super_iterator).node_;
          (inst->super_iterator).node_ =
               (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
          IRContext::KillInst((this->super_Pass).context_,pIVar5);
          if ((Instruction *)local_58._vptr_SmallVector != (Instruction *)0x0) {
            (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_58._vptr_SmallVector)->
              _vptr_IntrusiveNodeBase[1])();
          }
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&shiftOperand.words);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&newOperands);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool StrengthReductionPass::ReplaceMultiplyByPowerOf2(
    BasicBlock::iterator* inst) {
  assert((*inst)->opcode() == spv::Op::OpIMul &&
         "Only works for multiplication of integers.");
  bool modified = false;

  // Currently only works on 32-bit integers.
  if ((*inst)->type_id() != int32_type_id_ &&
      (*inst)->type_id() != uint32_type_id_) {
    return modified;
  }

  // Check the operands for a constant that is a power of 2.
  for (int i = 0; i < 2; i++) {
    uint32_t opId = (*inst)->GetSingleWordInOperand(i);
    Instruction* opInst = get_def_use_mgr()->GetDef(opId);
    if (opInst->opcode() == spv::Op::OpConstant) {
      // We found a constant operand.
      uint32_t constVal = opInst->GetSingleWordOperand(2);

      if (IsPowerOf2(constVal)) {
        modified = true;
        uint32_t shiftAmount = CountTrailingZeros(constVal);
        uint32_t shiftConstResultId = GetConstantId(shiftAmount);

        // Create the new instruction.
        uint32_t newResultId = TakeNextId();
        std::vector<Operand> newOperands;
        newOperands.push_back((*inst)->GetInOperand(1 - i));
        Operand shiftOperand(spv_operand_type_t::SPV_OPERAND_TYPE_ID,
                             {shiftConstResultId});
        newOperands.push_back(shiftOperand);
        std::unique_ptr<Instruction> newInstruction(
            new Instruction(context(), spv::Op::OpShiftLeftLogical,
                            (*inst)->type_id(), newResultId, newOperands));

        // Insert the new instruction and update the data structures.
        (*inst) = (*inst).InsertBefore(std::move(newInstruction));
        get_def_use_mgr()->AnalyzeInstDefUse(&*(*inst));
        ++(*inst);
        context()->ReplaceAllUsesWith((*inst)->result_id(), newResultId);

        // Remove the old instruction.
        Instruction* inst_to_delete = &*(*inst);
        --(*inst);
        context()->KillInst(inst_to_delete);

        // We do not want to replace the instruction twice if both operands
        // are constants that are a power of 2.  So we break here.
        break;
      }
    }
  }

  return modified;
}